

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

unsigned_short FloatToHalf(float x)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  
  uVar3 = (int)x + 0x1000;
  uVar2 = uVar3 >> 0x17 & 0xff;
  uVar5 = ((ushort)((uVar3 & 0x7fffff) >> 0xd) | (ushort)(uVar3 >> 0xd) & 0x7c00) ^ 0x4000;
  if (uVar2 < 0x71) {
    uVar5 = 0;
  }
  uVar4 = (ushort)(((uVar3 & 0x7fffff) + 0x7ff000 >> (0x7dU - (char)(uVar3 >> 0x17) & 0x1f)) + 1 >>
                  1);
  if (10 < uVar2 - 0x66) {
    uVar4 = 0;
  }
  uVar1 = 0x7fff;
  if (uVar2 < 0x90) {
    uVar1 = 0;
  }
  return uVar1 | (ushort)(uVar3 >> 0x10) & 0x8000 | uVar5 | uVar4;
}

Assistant:

static unsigned short FloatToHalf(float x)
{
    unsigned short result = 0;

    const unsigned int b = (*(unsigned int*) & x) + 0x00001000; // Round-to-nearest-even: add last bit after truncated mantissa
    const unsigned int e = (b & 0x7F800000) >> 23; // Exponent
    const unsigned int m = b & 0x007FFFFF; // Mantissa; in line below: 0x007FF000 = 0x00800000-0x00001000 = decimal indicator flag - initial rounding

    result = (b & 0x80000000) >> 16 | (e > 112)*((((e - 112) << 10) & 0x7C00) | m >> 13) | ((e < 113) & (e > 101))*((((0x007FF000 + m) >> (125 - e)) + 1) >> 1) | (e > 143)*0x7FFF; // sign : normalized : denormalized : saturate

    return result;
}